

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void bc_trie_free_node(bc_trie_t *trie,bc_trie_node_t *node)

{
  if (node != (bc_trie_node_t *)0x0) {
    if ((node->data != (void *)0x0) && (trie->free_func != (bc_free_func_t)0x0)) {
      (*trie->free_func)(node->data);
    }
    bc_trie_free_node(trie,node->next);
    bc_trie_free_node(trie,node->child);
    free(node);
    return;
  }
  return;
}

Assistant:

static void
bc_trie_free_node(bc_trie_t *trie, bc_trie_node_t *node)
{
    if (trie == NULL || node == NULL)
        return;
    if (node->data != NULL && trie->free_func != NULL)
        trie->free_func(node->data);
    bc_trie_free_node(trie, node->next);
    bc_trie_free_node(trie, node->child);
    free(node);
}